

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O2

void __thiscall CVmObjIterLookupTable::mark_refs(CVmObjIterLookupTable *this,uint state)

{
  vm_val_t coll;
  vm_val_t local_20;
  
  get_coll_val(this,&local_20);
  CVmObjTable::add_to_gc_queue(&G_obj_table_X,local_20.val.obj,state);
  return;
}

Assistant:

void CVmObjIterLookupTable::mark_refs(VMG_ uint state)
{
    vm_val_t coll;

    /* my collection is always an object - mark it as referenced */
    get_coll_val(&coll);
    G_obj_table->mark_all_refs(coll.val.obj, state);
}